

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawCircleSector(Vector2 center,float radius,float startAngle,float endAngle,int segments,
                     Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int local_3c;
  float local_38;
  int i;
  float angle;
  float stepLength;
  float th;
  int minSegments;
  float tmp;
  int segments_local;
  float endAngle_local;
  float startAngle_local;
  float radius_local;
  Color color_local;
  Vector2 center_local;
  
  endAngle_local = radius;
  if (radius <= 0.0) {
    endAngle_local = 0.1;
  }
  tmp = endAngle;
  segments_local = (int)startAngle;
  if (endAngle < startAngle) {
    tmp = startAngle;
    segments_local = (int)endAngle;
  }
  fVar1 = ceilf((tmp - (float)segments_local) / 90.0);
  minSegments = segments;
  if (segments < (int)fVar1) {
    fVar2 = powf(1.0 - 0.5 / endAngle_local,2.0);
    fVar2 = acosf(fVar2 + fVar2 + -1.0);
    fVar2 = ceilf(6.2831855 / fVar2);
    minSegments = (int)(((tmp - (float)segments_local) * fVar2) / 360.0);
    if (minSegments < 1) {
      minSegments = (int)fVar1;
    }
  }
  fVar1 = (tmp - (float)segments_local) / (float)minSegments;
  local_38 = (float)segments_local;
  rlCheckRenderBatchLimit((minSegments << 2) / 2);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  local_3c = 0;
  while( true ) {
    startAngle_local._0_1_ = color.r;
    startAngle_local._1_1_ = color.g;
    startAngle_local._2_1_ = color.b;
    startAngle_local._3_1_ = color.a;
    radius_local = center.x;
    color_local = (Color)center.y;
    if (minSegments / 2 <= local_3c) break;
    rlColor4ub(startAngle_local._0_1_,startAngle_local._1_1_,startAngle_local._2_1_,
               startAngle_local._3_1_);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(radius_local,(float)color_local);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar2 = sinf(local_38 * 0.017453292);
    fVar3 = cosf(local_38 * 0.017453292);
    rlVertex2f(fVar2 * endAngle_local + radius_local,fVar3 * endAngle_local + (float)color_local);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar2 = sinf((local_38 + fVar1) * 0.017453292);
    fVar3 = cosf((local_38 + fVar1) * 0.017453292);
    rlVertex2f(fVar2 * endAngle_local + radius_local,fVar3 * endAngle_local + (float)color_local);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    fVar2 = sinf((fVar1 + fVar1 + local_38) * 0.017453292);
    fVar3 = cosf((fVar1 + fVar1 + local_38) * 0.017453292);
    rlVertex2f(fVar2 * endAngle_local + radius_local,fVar3 * endAngle_local + (float)color_local);
    local_38 = fVar1 + fVar1 + local_38;
    local_3c = local_3c + 1;
  }
  if (minSegments % 2 != 0) {
    rlColor4ub(startAngle_local._0_1_,startAngle_local._1_1_,startAngle_local._2_1_,
               startAngle_local._3_1_);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(radius_local,(float)color_local);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar2 = sinf(local_38 * 0.017453292);
    fVar3 = cosf(local_38 * 0.017453292);
    rlVertex2f(fVar2 * endAngle_local + radius_local,fVar3 * endAngle_local + (float)color_local);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar2 = sinf((local_38 + fVar1) * 0.017453292);
    fVar1 = cosf((local_38 + fVar1) * 0.017453292);
    rlVertex2f(fVar2 * endAngle_local + radius_local,fVar1 * endAngle_local + (float)color_local);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    rlVertex2f(radius_local,(float)color_local);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawCircleSector(Vector2 center, float radius, float startAngle, float endAngle, int segments, Color color)
{
    if (radius <= 0.0f) radius = 0.1f;  // Avoid div by zero

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(4*segments/2);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        // NOTE: Every QUAD actually represents two segments
        for (int i = 0; i < segments/2; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength*2))*radius, center.y + cosf(DEG2RAD*(angle + stepLength*2))*radius);

            angle += (stepLength*2);
        }

        // NOTE: In case number of segments is odd, we add one last piece to the cake
        if (segments%2)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);
        }
    rlEnd();

    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(3*segments);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x, center.y);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            angle += stepLength;
        }
    rlEnd();
#endif
}